

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  ErrorMaker error;
  unsigned_long max_value_00;
  uint64_t max_value_01;
  string *psVar1;
  bool bVar2;
  FieldDescriptorProto_Type FVar3;
  int iVar4;
  uint uVar5;
  Token *pTVar6;
  AlphaNum *a;
  AlphaNum *a_00;
  io *this_00;
  string_view src;
  ErrorMaker local_290;
  ErrorMaker local_280;
  undefined1 local_270 [16];
  string local_260;
  anon_union_8_2_7976e4ae_for_ErrorMaker_0 local_240;
  _func_string_void_ptr *local_238;
  ErrorMaker local_230;
  ErrorMaker local_220;
  string_view local_210;
  string_view local_200;
  string local_1f0;
  ErrorMaker local_1d0;
  double local_1c0;
  double value_2;
  AlphaNum local_1a8;
  string local_178;
  ErrorMaker local_158;
  unsigned_long local_148;
  uint64_t value_1;
  string_view local_130;
  unsigned_long local_120;
  uint64_t max_value_1;
  string local_e8;
  ErrorMaker local_c8;
  unsigned_long local_b8;
  uint64_t value;
  uint64_t local_a0;
  uint64_t max_value;
  string *local_90;
  string *default_value;
  undefined1 local_78 [8];
  LocationRecorder location;
  string_view local_50;
  ErrorMaker local_40;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)field_location;
  field_location_local = (LocationRecorder *)field;
  field_local = (FieldDescriptorProto *)this;
  bVar2 = FieldDescriptorProto::has_default_value(field);
  if (bVar2) {
    ErrorMaker::ErrorMaker(&local_40,"Already set option \"default\".");
    RecordError(this,local_40);
    FieldDescriptorProto::clear_default_value((FieldDescriptorProto *)field_location_local);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"default");
  bVar2 = Consume(this,local_50);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_005a032c;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"=");
  bVar2 = Consume(this,stack0xffffffffffffffa0);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_005a032c;
  }
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)local_78,(LocationRecorder *)containing_file_local,7);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_78,(Message *)field_location_local,DEFAULT_VALUE);
  local_90 = FieldDescriptorProto::mutable_default_value_abi_cxx11_
                       ((FieldDescriptorProto *)field_location_local);
  bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)field_location_local);
  if (bVar2) {
    FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
    psVar1 = local_90;
    switch(FVar3) {
    case FieldDescriptorProto_Type_TYPE_DOUBLE:
    case FieldDescriptorProto_Type_TYPE_FLOAT:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&value_2,"-");
      bVar2 = TryConsume(this,_value_2);
      if (bVar2) {
        std::__cxx11::string::append((char *)local_90);
      }
      local_1c0 = 0.0;
      ErrorMaker::ErrorMaker(&local_1d0,"Expected number.");
      this_00 = (io *)&local_1c0;
      bVar2 = ConsumeNumber(this,(double *)this_00,local_1d0);
      psVar1 = local_90;
      if (bVar2) {
        io::SimpleDtoa_abi_cxx11_(&local_1f0,this_00,local_1c0);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_1f0);
        goto switchD_0059fb7f_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_INT64:
    case FieldDescriptorProto_Type_TYPE_INT32:
    case FieldDescriptorProto_Type_TYPE_SFIXED32:
    case FieldDescriptorProto_Type_TYPE_SFIXED64:
    case FieldDescriptorProto_Type_TYPE_SINT32:
    case FieldDescriptorProto_Type_TYPE_SINT64:
      local_a0 = std::numeric_limits<long>::max();
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if (((FVar3 == FieldDescriptorProto_Type_TYPE_INT32) ||
          (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
          FVar3 == FieldDescriptorProto_Type_TYPE_SINT32)) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_SFIXED32)) {
        iVar4 = std::numeric_limits<int>::max();
        local_a0 = (uint64_t)iVar4;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&value,"-");
      bVar2 = TryConsume(this,_value);
      if (bVar2) {
        std::__cxx11::string::append((char *)local_90);
        local_a0 = local_a0 + 1;
      }
      max_value_01 = local_a0;
      ErrorMaker::ErrorMaker(&local_c8,"Expected integer for field default value.");
      bVar2 = ConsumeInteger64(this,max_value_01,&local_b8,local_c8);
      psVar1 = local_90;
      if (bVar2) {
        absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&max_value_1,local_b8);
        absl::lts_20250127::StrCat_abi_cxx11_(&local_e8,(lts_20250127 *)&max_value_1,a);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_e8);
        goto switchD_0059fb7f_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_UINT64:
    case FieldDescriptorProto_Type_TYPE_FIXED64:
    case FieldDescriptorProto_Type_TYPE_FIXED32:
    case FieldDescriptorProto_Type_TYPE_UINT32:
      local_120 = std::numeric_limits<unsigned_long>::max();
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if ((FVar3 == FieldDescriptorProto_Type_TYPE_UINT32) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_FIXED32)) {
        uVar5 = std::numeric_limits<unsigned_int>::max();
        local_120 = (unsigned_long)uVar5;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"-");
      bVar2 = TryConsume(this,local_130);
      if (bVar2) {
        ErrorMaker::ErrorMaker
                  ((ErrorMaker *)&value_1,"Unsigned field can\'t have negative default value.");
        RecordError(this,_value_1);
      }
      max_value_00 = local_120;
      ErrorMaker::ErrorMaker(&local_158,"Expected integer for field default value.");
      bVar2 = ConsumeInteger64(this,max_value_00,&local_148,local_158);
      psVar1 = local_90;
      if (bVar2) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_1a8,local_148);
        absl::lts_20250127::StrCat_abi_cxx11_(&local_178,(lts_20250127 *)&local_1a8,a_00);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_178);
        goto switchD_0059fb7f_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BOOL:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,"true");
      bVar2 = TryConsume(this,local_200);
      if (bVar2) {
        std::__cxx11::string::assign((char *)local_90);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"false")
        ;
        bVar2 = TryConsume(this,local_210);
        if (!bVar2) {
          ErrorMaker::ErrorMaker(&local_220,"Expected \"true\" or \"false\".");
          RecordError(this,local_220);
          this_local._7_1_ = 0;
          break;
        }
        std::__cxx11::string::assign((char *)local_90);
      }
    default:
switchD_0059fb7f_default:
      this_local._7_1_ = 1;
      break;
    case FieldDescriptorProto_Type_TYPE_STRING:
      ErrorMaker::ErrorMaker(&local_230,"Expected string for field default value.");
      bVar2 = ConsumeString(this,psVar1,local_230);
      if (bVar2) goto switchD_0059fb7f_default;
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_GROUP:
    case FieldDescriptorProto_Type_TYPE_MESSAGE:
      ErrorMaker::ErrorMaker(&local_290,"Messages can\'t have default values.");
      RecordError(this,local_290);
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BYTES:
      ErrorMaker::ErrorMaker((ErrorMaker *)&local_240,"Expected string.");
      error.func_ = local_238;
      error.field_0.storage_ = local_240.storage_;
      bVar2 = ConsumeString(this,psVar1,error);
      if (bVar2) {
        local_270 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
        src._M_len = local_270._8_8_;
        src._M_str = (char *)local_238;
        absl::lts_20250127::CEscape_abi_cxx11_(&local_260,local_270._0_8_,src);
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        goto switchD_0059fb7f_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_ENUM:
      ErrorMaker::ErrorMaker(&local_280,"Expected enum identifier for field default value.");
      bVar2 = ConsumeIdentifier(this,psVar1,local_280);
      if (bVar2) goto switchD_0059fb7f_default;
      this_local._7_1_ = 0;
    }
  }
  else {
    pTVar6 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=((string *)local_90,(string *)&pTVar6->text);
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = 1;
  }
  max_value._4_4_ = 1;
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_78);
LAB_005a032c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field, const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    RecordError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  std::string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64_t max_value = std::numeric_limits<int64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = std::numeric_limits<int32_t>::max();
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(absl::StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64_t max_value = std::numeric_limits<uint64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = std::numeric_limits<uint32_t>::max();
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        RecordError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(absl::StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE: {
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value = 0.0;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(io::SimpleDtoa(value));
      break;
    }
    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        RecordError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file option java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value,
                       "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = absl::CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value,
                           "Expected enum identifier for field "
                           "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      RecordError("Messages can't have default values.");
      return false;
  }

  return true;
}